

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UText * shallowTextClone(UText *dest,UText *src,UErrorCode *status)

{
  int extraSpace;
  int32_t iVar1;
  void *pvVar2;
  UBool UVar3;
  int local_40;
  int sizeToCopy;
  int32_t flags;
  void *destExtra;
  int32_t srcExtraSize;
  UErrorCode *status_local;
  UText *src_local;
  UText *dest_local;
  
  UVar3 = U_FAILURE(*status);
  if (UVar3 == '\0') {
    extraSpace = src->extraSize;
    dest_local = utext_setup_63(dest,extraSpace,status);
    UVar3 = U_FAILURE(*status);
    if (UVar3 == '\0') {
      pvVar2 = dest_local->pExtra;
      iVar1 = dest_local->flags;
      local_40 = src->sizeOfStruct;
      if (dest_local->sizeOfStruct < local_40) {
        local_40 = dest_local->sizeOfStruct;
      }
      memcpy(dest_local,src,(long)local_40);
      dest_local->pExtra = pvVar2;
      dest_local->flags = iVar1;
      if (0 < extraSpace) {
        memcpy(dest_local->pExtra,src->pExtra,(long)extraSpace);
      }
      adjustPointer(dest_local,&dest_local->context,src);
      adjustPointer(dest_local,&dest_local->p,src);
      adjustPointer(dest_local,&dest_local->q,src);
      adjustPointer(dest_local,&dest_local->r,src);
      adjustPointer(dest_local,&dest_local->chunkContents,src);
      dest_local->providerProperties = dest_local->providerProperties & 0xffffffdf;
    }
  }
  else {
    dest_local = (UText *)0x0;
  }
  return dest_local;
}

Assistant:

static UText * U_CALLCONV
shallowTextClone(UText * dest, const UText * src, UErrorCode * status) {
    if (U_FAILURE(*status)) {
        return NULL;
    }
    int32_t  srcExtraSize = src->extraSize;

    //
    // Use the generic text_setup to allocate storage if required.
    //
    dest = utext_setup(dest, srcExtraSize, status);
    if (U_FAILURE(*status)) {
        return dest;
    }

    //
    //  flags (how the UText was allocated) and the pointer to the
    //   extra storage must retain the values in the cloned utext that
    //   were set up by utext_setup.  Save them separately before
    //   copying the whole struct.
    //
    void *destExtra = dest->pExtra;
    int32_t flags   = dest->flags;


    //
    //  Copy the whole UText struct by value.
    //  Any "Extra" storage is copied also.
    //
    int sizeToCopy = src->sizeOfStruct;
    if (sizeToCopy > dest->sizeOfStruct) {
        sizeToCopy = dest->sizeOfStruct;
    }
    uprv_memcpy(dest, src, sizeToCopy);
    dest->pExtra = destExtra;
    dest->flags  = flags;
    if (srcExtraSize > 0) {
        uprv_memcpy(dest->pExtra, src->pExtra, srcExtraSize);
    }

    //
    // Relocate any pointers in the target that refer to the UText itself
    //   to point to the cloned copy rather than the original source.
    //
    adjustPointer(dest, &dest->context, src);
    adjustPointer(dest, &dest->p, src);
    adjustPointer(dest, &dest->q, src);
    adjustPointer(dest, &dest->r, src);
    adjustPointer(dest, (const void **)&dest->chunkContents, src);

    // The newly shallow-cloned UText does _not_ own the underlying storage for the text.
    // (The source for the clone may or may not have owned the text.)

    dest->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_OWNS_TEXT);

    return dest;
}